

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall
CommandDrawSwitchableImage::Tick
          (CommandDrawSwitchableImage *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,
          bool hudChanged)

{
  APlayerPawn *pAVar1;
  PClass *pPVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  player_t *ppVar6;
  AInventory *pAVar7;
  undefined4 extraout_var;
  PClassActor *pPVar9;
  AInventory *pAVar10;
  FTexture *pFVar11;
  APlayerPawn **ppAVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  byte bVar16;
  uint uVar17;
  bool bVar18;
  byte bVar19;
  long lVar20;
  bool bVar21;
  FName species;
  undefined1 local_38 [4];
  FName local_34;
  PClass *pPVar8;
  
  switch(this->condition) {
  case WEAPONSLOT:
    ppVar6 = (statusBar->super_DBaseStatusBar).CPlayer;
    uVar14 = (ulong)this->conditionalValue[0];
    uVar17 = 1;
    if (0 < (int)(ppVar6->weapons).Slots[uVar14].Weapons.Count) {
      ppAVar12 = &ppVar6->mo + uVar14 * 2;
      lVar20 = 0;
      lVar15 = 0;
      do {
        pPVar9 = *(PClassActor **)
                  ((long)&(((FWeaponSlots *)(ppAVar12 + 0x3c))->Slots[0].Weapons.Array)->Type +
                  lVar20);
        if (pPVar9 != (PClassActor *)0x0) {
          pAVar10 = AActor::FindInventory(&ppVar6->mo->super_AActor,pPVar9,false);
          if (pAVar10 != (AInventory *)0x0) goto LAB_004c2709;
          ppVar6 = (statusBar->super_DBaseStatusBar).CPlayer;
          uVar14 = (ulong)(uint)this->conditionalValue[0];
        }
        lVar15 = lVar15 + 1;
        ppAVar12 = &ppVar6->mo + (long)(int)uVar14 * 2;
        lVar20 = lVar20 + 0x10;
      } while (lVar15 < (int)*(uint *)((long)ppAVar12 + 0x1ec));
    }
    goto LAB_004c272f;
  case INVULNERABILITY:
    uVar17 = 1;
    uVar13 = ((statusBar->super_DBaseStatusBar).CPlayer)->cheats & 0x2000002;
    break;
  case KEYSLOT:
    pAVar1 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pAVar10 = (pAVar1->super_AActor).Inventory.field_0.p;
    uVar17 = 1;
    if (pAVar10 == (AInventory *)0x0) goto LAB_004c272f;
    if (((pAVar10->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
      (pAVar1->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
      goto LAB_004c272f;
    }
    bVar3 = false;
    bVar4 = false;
    do {
      pAVar7 = pAVar10;
      pPVar2 = AKey::RegistrationInfo.MyClass;
      pPVar8 = (pAVar7->super_AActor).super_DThinker.super_DObject.Class;
      if (pPVar8 == (PClass *)0x0) {
        iVar5 = (**(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar7);
        pPVar8 = (PClass *)CONCAT44(extraout_var,iVar5);
        (pAVar7->super_AActor).super_DThinker.super_DObject.Class = pPVar8;
      }
      bVar21 = pPVar8 != (PClass *)0x0;
      if (pPVar8 != pPVar2 && bVar21) {
        do {
          pPVar8 = pPVar8->ParentClass;
          bVar21 = pPVar8 != (PClass *)0x0;
          if (pPVar8 == pPVar2) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      bVar18 = bVar4;
      if (bVar21) {
        bVar16 = pAVar7->field_0x4fc;
        if (bVar16 == 0) {
          AActor::GetSpecies((AActor *)local_38);
          if (local_38 == (undefined1  [4])this->keySpecies[0].Index) {
            bVar3 = true;
          }
          bVar21 = local_38 == (undefined1  [4])this->keySpecies[1].Index;
        }
        else {
          if (this->conditionalValue[0] == (uint)bVar16) {
            bVar3 = true;
          }
          bVar21 = this->conditionalValue[1] == (uint)bVar16;
        }
        if (bVar21) {
          bVar18 = true;
        }
        if (this->conditionAnd == false) {
          bVar18 = bVar4;
        }
      }
      pAVar10 = (pAVar7->super_AActor).Inventory.field_0.p;
      if (pAVar10 == (AInventory *)0x0) goto LAB_004c24d1;
      bVar4 = bVar18;
    } while (((pAVar10->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0);
    (pAVar7->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
LAB_004c24d1:
    if (this->conditionAnd != false) {
      if (bVar3) {
        uVar17 = 2;
        if (bVar18) goto LAB_004c2709;
      }
      else {
        uVar17 = (uint)bVar18 * 2 + 1;
      }
      goto LAB_004c272f;
    }
    uVar17 = 1;
    if (!bVar3) goto LAB_004c272f;
    goto LAB_004c2709;
  case ARMORTYPE:
    local_34.Index = 0x60;
    pAVar10 = AActor::FindInventory
                        (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,&local_34);
    if (pAVar10 == (AInventory *)0x0) goto LAB_004c2709;
    iVar5 = *(int *)((long)&pAVar10[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4);
    if (iVar5 == this->armorType[0]) {
      bVar3 = EvaluateOperation(this->conditionalOperator,this->conditionalValue,&pAVar10->Amount);
      iVar5 = *(int *)((long)&pAVar10[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4);
    }
    else {
      bVar3 = false;
    }
    if (iVar5 == this->armorType[1]) {
      bVar4 = EvaluateOperation(this->conditionalOperator + 1,this->conditionalValue + 1,
                                &pAVar10->Amount);
      if (this->conditionAnd == false) {
LAB_004c26dd:
        uVar17 = 1;
        if (bVar3 != false) goto LAB_004c2709;
        goto LAB_004c272f;
      }
      uVar17 = 3;
      if (bVar3 != false) {
        uVar17 = (uint)!bVar4 + (uint)!bVar4 * 2;
      }
      uVar13 = uVar17;
      if (bVar4) break;
    }
    else if (this->conditionAnd != true) goto LAB_004c26dd;
    uVar17 = bVar3 + 1;
    goto LAB_004c272f;
  default:
    pAVar1 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pPVar9 = PClass::FindActor(this->inventoryItem);
    uVar13 = 0;
    pAVar10 = AActor::FindInventory(&pAVar1->super_AActor,pPVar9,false);
    if ((pAVar10 == (AInventory *)0x0) ||
       (bVar3 = EvaluateOperation(this->conditionalOperator,this->conditionalValue,&pAVar10->Amount)
       , !bVar3)) {
      uVar13 = 1;
      bVar16 = 1;
      bVar19 = 0;
    }
    else {
      bVar19 = 1;
      bVar16 = 0;
    }
    uVar17 = uVar13;
    if (this->conditionAnd == true) {
      pAVar1 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
      pPVar9 = PClass::FindActor(this->inventoryItem + 1);
      pAVar10 = AActor::FindInventory(&pAVar1->super_AActor,pPVar9,false);
      if (pAVar10 == (AInventory *)0x0) {
        uVar17 = 1;
        if (bVar19 == 0) goto LAB_004c272f;
      }
      else {
        bVar3 = EvaluateOperation(this->conditionalOperator + 1,this->conditionalValue + 1,
                                  &pAVar10->Amount);
        if ((bVar19 & bVar3) != 0) goto LAB_004c2709;
        uVar17 = 3;
        if ((bVar16 & bVar3) != 0) goto LAB_004c272f;
        uVar17 = uVar13;
        if ((bVar19 & !bVar3) == 0) break;
      }
      uVar17 = 2;
      goto LAB_004c272f;
    }
  }
  if (uVar13 == 0) {
LAB_004c2709:
    CommandDrawImage::Tick(&this->super_CommandDrawImage,block,statusBar,hudChanged);
    return;
  }
LAB_004c272f:
  pFVar11 = FImageCollection::operator[](&statusBar->Images,this->conditionalImage[uVar17 - 1]);
  (this->super_CommandDrawImage).texture = pFVar11;
  (this->super_CommandDrawImage).alpha = 1.0;
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			// DrawSwitchable image allows 2 or 4 images to be supplied.
			// drawAlt toggles these:
			// 1 = first image
			// 2 = second image
			// 3 = thrid image
			// 0 = last image
			int drawAlt = 0;
			if(condition == WEAPONSLOT) //weaponslots
			{
				drawAlt = 1; //draw off state until we know we have something.
				for (int i = 0; i < statusBar->CPlayer->weapons.Slots[conditionalValue[0]].Size(); i++)
				{
					PClassActor *weap = statusBar->CPlayer->weapons.Slots[conditionalValue[0]].GetWeapon(i);
					if(weap == NULL)
					{
						continue;
					}
					else if(statusBar->CPlayer->mo->FindInventory(weap) != NULL)
					{
						drawAlt = 0;
						break;
					}
				}
			}
			else if(condition == INVULNERABILITY)
			{
				if(statusBar->CPlayer->cheats&(CF_GODMODE|CF_GODMODE2))
				{
					drawAlt = 1;
				}
			}
			else if(condition == KEYSLOT)
			{
				bool found1 = false;
				bool found2 = false;
				drawAlt = 1;

				for(AInventory *item = statusBar->CPlayer->mo->Inventory;item != NULL;item = item->Inventory)
				{
					if(item->IsKindOf(RUNTIME_CLASS(AKey)))
					{
						int keynum = static_cast<AKey *>(item)->KeyNumber;
						if(keynum)
						{
							if(keynum == conditionalValue[0])
								found1 = true;
							if(conditionAnd && keynum == conditionalValue[1]) // two keys
								found2 = true;
						}
						else
						{
							FName species = item->GetSpecies();
							if(species == keySpecies[0])
								found1 = true;
							if(conditionAnd && species == keySpecies[1])
								found2 = true;
						}
					}
				}

				if(conditionAnd)
				{
					if(found1 && found2)
						drawAlt = 0;
					else if(found1)
						drawAlt = 2;
					else if(found2)
						drawAlt = 3;
				}
				else
				{
					if(found1)
						drawAlt = 0;
				}
			}
			else if(condition == ARMORTYPE)
			{
				ABasicArmor *armor = (ABasicArmor *) statusBar->CPlayer->mo->FindInventory(NAME_BasicArmor);
				if(armor != NULL)
				{
					bool matches1 = armor->ArmorType.GetIndex() == armorType[0] && EvaluateOperation(conditionalOperator[0], conditionalValue[0], armor->Amount);
					bool matches2 = armor->ArmorType.GetIndex() == armorType[1] && EvaluateOperation(conditionalOperator[1], conditionalValue[1], armor->Amount);

					drawAlt = 1;
					if(conditionAnd)
					{
						if(matches1 && matches2)
							drawAlt = 0;
						else if(matches2)
							drawAlt = 3;
						else if(matches1)
							drawAlt = 2;
					}
					else if(matches1)
						drawAlt = 0;
				}
			}
			else //check the inventory items and draw selected sprite
			{
				AInventory* item = statusBar->CPlayer->mo->FindInventory(PClass::FindActor(inventoryItem[0]));
				if(item == NULL || !EvaluateOperation(conditionalOperator[0], conditionalValue[0], item->Amount))
					drawAlt = 1;
				if(conditionAnd)
				{
					item = statusBar->CPlayer->mo->FindInventory(PClass::FindActor(inventoryItem[1]));
					bool secondCondition = item != NULL && EvaluateOperation(conditionalOperator[1], conditionalValue[1], item->Amount);
					if((item != NULL && secondCondition) && drawAlt == 0) //both
					{
						drawAlt = 0;
					}
					else if((item != NULL && secondCondition) && drawAlt == 1) //2nd
					{
						drawAlt = 3;
					}
					else if((item == NULL || !secondCondition) && drawAlt == 0) //1st
					{
						drawAlt = 2;
					}
				}
			}
			if(drawAlt != 0) //draw 'off' image
			{
				texture = statusBar->Images[conditionalImage[drawAlt-1]];

				// Since we're not going to call our parent's tick() method,
				// be sure to set the alpha value properly.
				alpha = 1.;
				return;
			}
			CommandDrawImage::Tick(block, statusBar, hudChanged);
		}